

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O0

size_t __thiscall lan::safe_file::length(safe_file *this)

{
  int iVar1;
  char *__filename;
  FILE *pFVar2;
  undefined1 local_19;
  size_t sStack_18;
  char data_c;
  size_t length;
  safe_file *this_local;
  
  length = (size_t)this;
  close_fd(this);
  sStack_18 = 0;
  __filename = (char *)std::__cxx11::string::data();
  pFVar2 = fopen(__filename,"r");
  this->file = (FILE *)pFVar2;
  if (pFVar2 != (FILE *)0x0) {
    local_19 = 0;
    while (iVar1 = feof((FILE *)this->file), iVar1 == 0) {
      fread(&local_19,1,1,(FILE *)this->file);
      sStack_18 = sStack_18 + 1;
    }
  }
  return sStack_18;
}

Assistant:

size_t safe_file::length(){
        close_fd();
        size_t length = 0;
        if((file = fopen(filename.data(), "r"))){
            char data_c = 0;
            while(!feof(file)){
                fread(&data_c, sizeof(char), 1, file); length++;
            }
        } return length;
    }